

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rva.inc.c
# Opt level: O0

_Bool gen_amo(DisasContext_conflict12 *ctx,arg_atomic *a,
             _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_TCGArg_MemOp *func,MemOp mop)

{
  TCGContext_conflict11 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 src2;
  TCGv_i64 src1;
  TCGContext_conflict11 *tcg_ctx;
  MemOp mop_local;
  _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_TCGArg_MemOp *func_local;
  arg_atomic *a_local;
  DisasContext_conflict12 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx_00);
  t_00 = tcg_temp_new_i64(tcg_ctx_00);
  gen_get_gpr(tcg_ctx_00,t,a->rs1);
  gen_get_gpr(tcg_ctx_00,t_00,a->rs2);
  (*func)(tcg_ctx_00,t_00,t,t_00,(TCGArg)ctx->mem_idx,mop);
  gen_set_gpr(tcg_ctx_00,a->rd,t_00);
  tcg_temp_free_i64(tcg_ctx_00,t);
  tcg_temp_free_i64(tcg_ctx_00,t_00);
  return true;
}

Assistant:

static bool gen_amo(DisasContext *ctx, arg_atomic *a,
                    void(*func)(TCGContext *, TCGv, TCGv, TCGv, TCGArg, MemOp),
                    MemOp mop)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv src1 = tcg_temp_new(tcg_ctx);
    TCGv src2 = tcg_temp_new(tcg_ctx);

    gen_get_gpr(tcg_ctx, src1, a->rs1);
    gen_get_gpr(tcg_ctx, src2, a->rs2);

    (*func)(tcg_ctx, src2, src1, src2, ctx->mem_idx, mop);

    gen_set_gpr(tcg_ctx, a->rd, src2);
    tcg_temp_free(tcg_ctx, src1);
    tcg_temp_free(tcg_ctx, src2);
    return true;
}